

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

void helper_msa_ctcmsa_mipsel(CPUMIPSState_conflict4 *env,target_ulong_conflict elm,uint32_t cd)

{
  uintptr_t unaff_retaddr;
  uint32_t cd_local;
  target_ulong_conflict elm_local;
  CPUMIPSState_conflict4 *env_local;
  
  if ((cd != 0) && (cd == 1)) {
    (env->active_tc).msacsr = elm & 0x107ffff;
    restore_msa_fp_status(env);
    if ((((env->active_tc).msacsr >> 7 & 0x1fU | 0x20) & (env->active_tc).msacsr >> 0xc & 0x3fU) !=
        0) {
      do_raise_exception(env,0x23,unaff_retaddr);
    }
  }
  return;
}

Assistant:

void helper_msa_ctcmsa(CPUMIPSState *env, target_ulong elm, uint32_t cd)
{
    switch (cd) {
    case 0:
        break;
    case 1:
        env->active_tc.msacsr = (int32_t)elm & MSACSR_MASK;
        restore_msa_fp_status(env);
        /* check exception */
        if ((GET_FP_ENABLE(env->active_tc.msacsr) | FP_UNIMPLEMENTED)
            & GET_FP_CAUSE(env->active_tc.msacsr)) {
            do_raise_exception(env, EXCP_MSAFPE, GETPC());
        }
        break;
    }
}